

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# materials.cpp
# Opt level: O2

CoatedDiffuseMaterial *
pbrt::CoatedDiffuseMaterial::Create
          (TextureParameterDictionary *parameters,Image *normalMap,FileLoc *loc,Allocator alloc)

{
  bool bVar1;
  int iVar2;
  int iVar3;
  uintptr_t iptr_1;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  undefined4 extraout_var_02;
  CoatedDiffuseMaterial *pCVar4;
  uintptr_t iptr;
  bool remapRoughness;
  string local_b8;
  LayeredBxDFConfig local_94;
  allocator<char> local_91;
  FloatTextureHandle thickness;
  FloatTextureHandle g;
  SpectrumTextureHandle albedo;
  FloatTextureHandle vRoughness;
  FloatTextureHandle uRoughness;
  FloatTextureHandle eta;
  SpectrumTextureHandle reflectance;
  FloatTextureHandle displacement;
  Image *normalMap_local;
  Allocator alloc_local;
  undefined8 local_40;
  undefined8 local_38;
  
  normalMap_local = normalMap;
  alloc_local = alloc;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_b8,"reflectance",(allocator<char> *)&uRoughness);
  local_38 = 0;
  TextureParameterDictionary::GetSpectrumTexture
            ((TextureParameterDictionary *)&reflectance,(string *)parameters,
             (SpectrumHandle *)&local_b8,(SpectrumType)&local_38,(Allocator)0x0);
  std::__cxx11::string::~string((string *)&local_b8);
  if (((ulong)reflectance.
              super_TaggedPointer<pbrt::SpectrumImageTexture,_pbrt::GPUSpectrumImageTexture,_pbrt::SpectrumMixTexture,_pbrt::SpectrumScaledTexture,_pbrt::SpectrumConstantTexture,_pbrt::SpectrumBilerpTexture,_pbrt::SpectrumCheckerboardTexture,_pbrt::MarbleTexture,_pbrt::SpectrumDotsTexture,_pbrt::SpectrumPtexTexture>
              .bits & 0xffffffffffff) == 0) {
    iVar2 = (*(alloc.memoryResource)->_vptr_memory_resource[2])(alloc.memoryResource,4);
    *(undefined4 *)CONCAT44(extraout_var,iVar2) = 0x3f000000;
    iVar3 = (*(alloc.memoryResource)->_vptr_memory_resource[2])(alloc.memoryResource,8);
    *(ulong *)CONCAT44(extraout_var_00,iVar3) = CONCAT44(extraout_var,iVar2) | 0x1000000000000;
    reflectance.
    super_TaggedPointer<pbrt::SpectrumImageTexture,_pbrt::GPUSpectrumImageTexture,_pbrt::SpectrumMixTexture,_pbrt::SpectrumScaledTexture,_pbrt::SpectrumConstantTexture,_pbrt::SpectrumBilerpTexture,_pbrt::SpectrumCheckerboardTexture,_pbrt::MarbleTexture,_pbrt::SpectrumDotsTexture,_pbrt::SpectrumPtexTexture>
    .bits = (TaggedPointer<pbrt::SpectrumImageTexture,_pbrt::GPUSpectrumImageTexture,_pbrt::SpectrumMixTexture,_pbrt::SpectrumScaledTexture,_pbrt::SpectrumConstantTexture,_pbrt::SpectrumBilerpTexture,_pbrt::SpectrumCheckerboardTexture,_pbrt::MarbleTexture,_pbrt::SpectrumDotsTexture,_pbrt::SpectrumPtexTexture>
             )(CONCAT44(extraout_var_00,iVar3) | 0x5000000000000);
  }
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_b8,"uroughness",(allocator<char> *)&vRoughness);
  TextureParameterDictionary::GetFloatTextureOrNull
            ((TextureParameterDictionary *)&uRoughness,(string *)parameters,
             (memory_resource *)&local_b8);
  std::__cxx11::string::~string((string *)&local_b8);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_b8,"vroughness",(allocator<char> *)&thickness);
  TextureParameterDictionary::GetFloatTextureOrNull
            ((TextureParameterDictionary *)&vRoughness,(string *)parameters,
             (memory_resource *)&local_b8);
  std::__cxx11::string::~string((string *)&local_b8);
  if (((ulong)uRoughness.
              super_TaggedPointer<pbrt::FloatImageTexture,_pbrt::GPUFloatImageTexture,_pbrt::FloatMixTexture,_pbrt::FloatScaledTexture,_pbrt::FloatConstantTexture,_pbrt::FloatBilerpTexture,_pbrt::FloatCheckerboardTexture,_pbrt::FloatDotsTexture,_pbrt::FBmTexture,_pbrt::FloatPtexTexture,_pbrt::WindyTexture,_pbrt::WrinkledTexture>
              .bits & 0xffffffffffff) == 0) {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_b8,"roughness",(allocator<char> *)&eta);
    TextureParameterDictionary::GetFloatTexture
              ((TextureParameterDictionary *)&thickness,(string *)parameters,0.0,
               (memory_resource *)&local_b8);
    uRoughness = thickness;
    std::__cxx11::string::~string((string *)&local_b8);
  }
  if (((ulong)vRoughness.
              super_TaggedPointer<pbrt::FloatImageTexture,_pbrt::GPUFloatImageTexture,_pbrt::FloatMixTexture,_pbrt::FloatScaledTexture,_pbrt::FloatConstantTexture,_pbrt::FloatBilerpTexture,_pbrt::FloatCheckerboardTexture,_pbrt::FloatDotsTexture,_pbrt::FBmTexture,_pbrt::FloatPtexTexture,_pbrt::WindyTexture,_pbrt::WrinkledTexture>
              .bits & 0xffffffffffff) == 0) {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_b8,"roughness",(allocator<char> *)&eta);
    TextureParameterDictionary::GetFloatTexture
              ((TextureParameterDictionary *)&thickness,(string *)parameters,0.0,
               (memory_resource *)&local_b8);
    vRoughness = thickness;
    std::__cxx11::string::~string((string *)&local_b8);
  }
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_b8,"thickness",(allocator<char> *)&eta);
  TextureParameterDictionary::GetFloatTexture
            ((TextureParameterDictionary *)&thickness,(string *)parameters,0.01,
             (memory_resource *)&local_b8);
  std::__cxx11::string::~string((string *)&local_b8);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_b8,"eta",(allocator<char> *)&g);
  TextureParameterDictionary::GetFloatTexture
            ((TextureParameterDictionary *)&eta,(string *)parameters,1.5,
             (memory_resource *)&local_b8);
  std::__cxx11::string::~string((string *)&local_b8);
  local_94.twoSided = '\x01';
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_b8,"maxdepth",(allocator<char> *)&g);
  iVar2 = TextureParameterDictionary::GetOneInt(parameters,&local_b8,10);
  local_94.maxDepth = (uint8_t)iVar2;
  std::__cxx11::string::~string((string *)&local_b8);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_b8,"nsamples",(allocator<char> *)&g);
  iVar2 = TextureParameterDictionary::GetOneInt(parameters,&local_b8,1);
  local_94.nSamples = (uint8_t)iVar2;
  std::__cxx11::string::~string((string *)&local_b8);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_b8,"twosided",(allocator<char> *)&g);
  local_94.twoSided = TextureParameterDictionary::GetOneBool(parameters,&local_b8,true);
  std::__cxx11::string::~string((string *)&local_b8);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_b8,"g",(allocator<char> *)&albedo);
  TextureParameterDictionary::GetFloatTexture
            ((TextureParameterDictionary *)&g,(string *)parameters,0.0,(memory_resource *)&local_b8)
  ;
  std::__cxx11::string::~string((string *)&local_b8);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_b8,"albedo",(allocator<char> *)&displacement);
  local_40 = 0;
  TextureParameterDictionary::GetSpectrumTexture
            ((TextureParameterDictionary *)&albedo,(string *)parameters,(SpectrumHandle *)&local_b8,
             (SpectrumType)&local_40,(Allocator)0x0);
  std::__cxx11::string::~string((string *)&local_b8);
  if (((ulong)albedo.
              super_TaggedPointer<pbrt::SpectrumImageTexture,_pbrt::GPUSpectrumImageTexture,_pbrt::SpectrumMixTexture,_pbrt::SpectrumScaledTexture,_pbrt::SpectrumConstantTexture,_pbrt::SpectrumBilerpTexture,_pbrt::SpectrumCheckerboardTexture,_pbrt::MarbleTexture,_pbrt::SpectrumDotsTexture,_pbrt::SpectrumPtexTexture>
              .bits & 0xffffffffffff) == 0) {
    iVar2 = (*(alloc.memoryResource)->_vptr_memory_resource[2])(alloc.memoryResource,4);
    *(undefined4 *)CONCAT44(extraout_var_01,iVar2) = 0;
    iVar3 = (*(alloc.memoryResource)->_vptr_memory_resource[2])(alloc.memoryResource,8);
    albedo.
    super_TaggedPointer<pbrt::SpectrumImageTexture,_pbrt::GPUSpectrumImageTexture,_pbrt::SpectrumMixTexture,_pbrt::SpectrumScaledTexture,_pbrt::SpectrumConstantTexture,_pbrt::SpectrumBilerpTexture,_pbrt::SpectrumCheckerboardTexture,_pbrt::MarbleTexture,_pbrt::SpectrumDotsTexture,_pbrt::SpectrumPtexTexture>
    .bits = (TaggedPointer<pbrt::SpectrumImageTexture,_pbrt::GPUSpectrumImageTexture,_pbrt::SpectrumMixTexture,_pbrt::SpectrumScaledTexture,_pbrt::SpectrumConstantTexture,_pbrt::SpectrumBilerpTexture,_pbrt::SpectrumCheckerboardTexture,_pbrt::MarbleTexture,_pbrt::SpectrumDotsTexture,_pbrt::SpectrumPtexTexture>
             )(CONCAT44(extraout_var_02,iVar3) | 0x5000000000000);
    *(ulong *)CONCAT44(extraout_var_02,iVar3) = CONCAT44(extraout_var_01,iVar2) | 0x1000000000000;
  }
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_b8,"displacement",(allocator<char> *)&remapRoughness);
  TextureParameterDictionary::GetFloatTextureOrNull
            ((TextureParameterDictionary *)&displacement,(string *)parameters,
             (memory_resource *)&local_b8);
  std::__cxx11::string::~string((string *)&local_b8);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_b8,"remaproughness",&local_91)
  ;
  bVar1 = TextureParameterDictionary::GetOneBool(parameters,&local_b8,true);
  std::__cxx11::string::~string((string *)&local_b8);
  remapRoughness = bVar1;
  pCVar4 = pstd::pmr::polymorphic_allocator<std::byte>::
           new_object<pbrt::CoatedDiffuseMaterial,pbrt::SpectrumTextureHandle&,pbrt::FloatTextureHandle&,pbrt::FloatTextureHandle&,pbrt::FloatTextureHandle&,pbrt::SpectrumTextureHandle&,pbrt::FloatTextureHandle&,pbrt::FloatTextureHandle&,pbrt::FloatTextureHandle&,pbrt::Image*&,bool&,pbrt::LayeredBxDFConfig&>
                     (&alloc_local,&reflectance,&uRoughness,&vRoughness,&thickness,&albedo,&g,&eta,
                      &displacement,&normalMap_local,&remapRoughness,&local_94);
  return pCVar4;
}

Assistant:

CoatedDiffuseMaterial *CoatedDiffuseMaterial::Create(
    const TextureParameterDictionary &parameters, Image *normalMap, const FileLoc *loc,
    Allocator alloc) {
    SpectrumTextureHandle reflectance = parameters.GetSpectrumTexture(
        "reflectance", nullptr, SpectrumType::Albedo, alloc);
    if (!reflectance)
        reflectance = alloc.new_object<SpectrumConstantTexture>(
            alloc.new_object<ConstantSpectrum>(0.5f));

    FloatTextureHandle uRoughness = parameters.GetFloatTextureOrNull("uroughness", alloc);
    FloatTextureHandle vRoughness = parameters.GetFloatTextureOrNull("vroughness", alloc);
    if (!uRoughness)
        uRoughness = parameters.GetFloatTexture("roughness", 0.f, alloc);
    if (!vRoughness)
        vRoughness = parameters.GetFloatTexture("roughness", 0.f, alloc);

    FloatTextureHandle thickness = parameters.GetFloatTexture("thickness", .01, alloc);
    FloatTextureHandle eta = parameters.GetFloatTexture("eta", 1.5, alloc);

    LayeredBxDFConfig config;
    config.maxDepth = parameters.GetOneInt("maxdepth", config.maxDepth);
    config.nSamples = parameters.GetOneInt("nsamples", config.nSamples);
    config.twoSided = parameters.GetOneBool("twosided", config.twoSided);

    FloatTextureHandle g = parameters.GetFloatTexture("g", 0.f, alloc);
    SpectrumTextureHandle albedo =
        parameters.GetSpectrumTexture("albedo", nullptr, SpectrumType::Albedo, alloc);
    if (!albedo)
        albedo = alloc.new_object<SpectrumConstantTexture>(
            alloc.new_object<ConstantSpectrum>(0.f));

    FloatTextureHandle displacement =
        parameters.GetFloatTextureOrNull("displacement", alloc);
    bool remapRoughness = parameters.GetOneBool("remaproughness", true);

    return alloc.new_object<CoatedDiffuseMaterial>(
        reflectance, uRoughness, vRoughness, thickness, albedo, g, eta, displacement,
        normalMap, remapRoughness, config);
}